

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O2

MaybeResult<wasm::Ok> *
wasm::WATParser::trytable<wasm::WATParser::ParseDefsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *ctx,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,bool folded)

{
  Lexer *this;
  size_t sVar1;
  optional<wasm::Name> label_00;
  bool bVar2;
  _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err> *p_Var3;
  undefined7 in_register_00000009;
  MaybeResult<wasm::Ok> *this_00;
  string *this_01;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_180 [8];
  Result<wasm::HeapType> type;
  string local_138;
  string local_118;
  string local_f8 [32];
  undefined1 auStack_d8 [8];
  vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  catches;
  optional<wasm::Name> label;
  undefined1 auStack_98 [8];
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> _val_1;
  undefined1 auStack_60 [8];
  MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> c;
  
  this = &ctx->in;
  sVar1 = (ctx->in).pos;
  c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
  _32_8_ = __return_storage_ptr__;
  if ((int)CONCAT71(in_register_00000009,folded) == 0) {
    expected_00._M_str = "try_table";
    expected_00._M_len = 9;
    bVar2 = Lexer::takeKeyword(this,expected_00);
  }
  else {
    expected._M_str = "try_table";
    expected._M_len = 9;
    bVar2 = Lexer::takeSExprStart(this,expected);
  }
  if (bVar2 == false) {
    *(undefined1 *)
     (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _32_8_ + 0x20) = 1;
    return (MaybeResult<wasm::Ok> *)
           c.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._32_8_;
  }
  Lexer::takeID((optional<wasm::Name> *)
                &catches.
                 super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,this);
  blocktype<wasm::WATParser::ParseDefsCtx>((Result<wasm::HeapType> *)local_180,ctx);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)auStack_60,
             (_Copy_ctor_base<false,_wasm::HeapType,_wasm::Err> *)local_180);
  if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)auStack_98,(string *)auStack_60);
    this_00 = (MaybeResult<wasm::Ok> *)
              c.val.
              super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              ._32_8_;
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
               c.val.
               super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               ._32_8_,auStack_98);
    std::__cxx11::string::~string((string *)auStack_98);
    std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)auStack_60);
    goto LAB_00c709b2;
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)auStack_60);
  auStack_d8 = (undefined1  [8])0x0;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  catches.
  super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while (catchinstr<wasm::WATParser::ParseDefsCtx>
                   ((MaybeResult<wasm::WATParser::ParseDefsCtx::CatchInfo> *)auStack_60,ctx),
        c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ != '\x01') {
    std::__detail::__variant::
    _Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    _Copy_ctor_base((_Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     *)auStack_98,
                    (_Copy_ctor_base<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     *)auStack_60);
    if (_val_1.val.
        super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\x02') {
      std::__cxx11::string::string(local_f8,(string *)auStack_98);
      this_00 = (MaybeResult<wasm::Ok> *)
                c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._32_8_;
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                 c.val.
                 super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 ._32_8_,local_f8);
      std::__cxx11::string::~string(local_f8);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         *)auStack_98);
      std::__detail::__variant::
      _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
      ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                         *)auStack_60);
      goto LAB_00c709a6;
    }
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_98);
    p_Var3 = (_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              *)0x0;
    if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\0') {
      p_Var3 = (_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                *)auStack_60;
    }
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_str =
         (char *)*(undefined8 *)&(p_Var3->_M_u)._M_first._M_storage.label;
    auStack_98 = (undefined1  [8])(p_Var3->_M_u)._M_first._M_storage.tag.super_IString.str._M_len;
    _val_1.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
    _M_u._M_first._M_storage.tag.super_IString.str._M_len =
         (size_t)(p_Var3->_M_u)._M_first._M_storage.tag.super_IString.str._M_str;
    std::
    vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
    ::push_back((vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                 *)auStack_d8,(value_type *)auStack_98);
    std::__detail::__variant::
    _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
    ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                       *)auStack_60);
  }
  std::__detail::__variant::
  _Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>::
  ~_Variant_storage((_Variant_storage<false,_wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                     *)auStack_60);
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._17_7_ =
       label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
       super__Optional_payload_base<wasm::Name>._M_payload._9_7_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_engaged =
       (bool)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::Name>._M_payload._8_1_;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_str =
       (char *)label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len
  ;
  label_00.super__Optional_base<wasm::Name,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len =
       (size_t)catches.
               super__Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ParseDefsCtx::makeTryTable
            ((Result<wasm::Ok> *)auStack_60,ctx,(Index)sVar1,annotations,label_00,
             (HeapType)local_180,
             (vector<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
              *)auStack_d8);
  if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
      _M_u._24_1_ == '\x01') {
    std::__cxx11::string::string((string *)auStack_98,(string *)auStack_60);
    this_00 = (MaybeResult<wasm::Ok> *)
              c.val.
              super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              ._32_8_;
    std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
    _Variant_storage<2ul,wasm::Err>
              ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
               c.val.
               super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
               super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               .
               super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
               ._32_8_,auStack_98);
LAB_00c70991:
    std::__cxx11::string::~string((string *)auStack_98);
LAB_00c7099d:
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_60);
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_60);
    instrs<wasm::WATParser::ParseDefsCtx>((Result<wasm::Ok> *)auStack_60,ctx);
    if (c.val.super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
        super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
        ._M_u._24_1_ == '\x01') {
      std::__cxx11::string::string((string *)auStack_98,(string *)auStack_60);
      this_00 = (MaybeResult<wasm::Ok> *)
                c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._32_8_;
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)
                 c.val.
                 super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 .
                 super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                 ._32_8_,auStack_98);
      goto LAB_00c70991;
    }
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)auStack_60);
    if (folded) {
      bVar2 = Lexer::takeRParen(this);
      this_00 = (MaybeResult<wasm::Ok> *)
                c.val.
                super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                .
                super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
                ._32_8_;
      if (!bVar2) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20),
                   "expected \')\' at end of try_table",(allocator<char> *)auStack_98);
        Lexer::err((Err *)auStack_60,this,
                   (string *)
                   ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                           super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                           super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20));
        std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
        _Variant_storage<2ul,wasm::Err>
                  ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)this_00,auStack_60);
        std::__cxx11::string::~string((string *)auStack_60);
        this_01 = (string *)
                  ((long)&type.val.super__Variant_base<wasm::HeapType,_wasm::Err>.
                          super__Move_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_assign_alias<wasm::HeapType,_wasm::Err>.
                          super__Move_ctor_alias<wasm::HeapType,_wasm::Err>.
                          super__Copy_ctor_alias<wasm::HeapType,_wasm::Err> + 0x20);
        goto LAB_00c70b46;
      }
LAB_00c70adf:
      ParseDefsCtx::visitEnd((Result<wasm::Ok> *)auStack_60,ctx);
      MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(this_00,(Result<wasm::Ok> *)auStack_60);
      goto LAB_00c7099d;
    }
    expected_01._M_str = "end";
    expected_01._M_len = 3;
    bVar2 = Lexer::takeKeyword(this,expected_01);
    this_00 = (MaybeResult<wasm::Ok> *)
              c.val.
              super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
              super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              .
              super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
              ._32_8_;
    if (bVar2) {
      Lexer::takeID((optional<wasm::Name> *)auStack_98,this);
      if ((_val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._8_1_ != '\x01') ||
         ((label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_payload._8_1_ == '\x01' &&
          (_val_1.val.
           super__Variant_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Move_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .
           super__Copy_assign_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           .super__Move_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Copy_ctor_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>.
           super__Variant_storage_alias<wasm::WATParser::ParseDefsCtx::CatchInfo,_wasm::None,_wasm::Err>
           ._M_u._M_first._M_storage.tag.super_IString.str._M_len ==
           label.super__Optional_base<wasm::Name,_true,_true>._M_payload.
           super__Optional_payload_base<wasm::Name>._M_payload._M_value.super_IString.str._M_len))))
      goto LAB_00c70adf;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_118,"end label does not match try_table label",
                 (allocator<char> *)local_f8);
      Lexer::err((Err *)auStack_60,this,&local_118);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)this_00,auStack_60);
      std::__cxx11::string::~string((string *)auStack_60);
      this_01 = &local_118;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"expected \'end\' at end of try_table",
                 (allocator<char> *)auStack_98);
      Lexer::err((Err *)auStack_60,this,&local_138);
      std::__detail::__variant::_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err>::
      _Variant_storage<2ul,wasm::Err>
                ((_Variant_storage<false,wasm::Ok,wasm::None,wasm::Err> *)this_00,auStack_60);
      std::__cxx11::string::~string((string *)auStack_60);
      this_01 = &local_138;
    }
LAB_00c70b46:
    std::__cxx11::string::~string((string *)this_01);
  }
LAB_00c709a6:
  std::
  _Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
  ::~_Vector_base((_Vector_base<wasm::WATParser::ParseDefsCtx::CatchInfo,_std::allocator<wasm::WATParser::ParseDefsCtx::CatchInfo>_>
                   *)auStack_d8);
LAB_00c709b2:
  std::__detail::__variant::_Variant_storage<false,_wasm::HeapType,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::HeapType,_wasm::Err> *)local_180);
  return this_00;
}

Assistant:

MaybeResult<>
trytable(Ctx& ctx, const std::vector<Annotation>& annotations, bool folded) {
  auto pos = ctx.in.getPos();

  if ((folded && !ctx.in.takeSExprStart("try_table"sv)) ||
      (!folded && !ctx.in.takeKeyword("try_table"sv))) {
    return {};
  }

  auto label = ctx.in.takeID();

  auto type = blocktype(ctx);
  CHECK_ERR(type);

  auto catches = ctx.makeCatchList();
  while (auto c = catchinstr(ctx)) {
    CHECK_ERR(c);
    ctx.appendCatch(catches, *c);
  }

  CHECK_ERR(ctx.makeTryTable(pos, annotations, label, *type, catches));

  CHECK_ERR(instrs(ctx));

  if (folded) {
    if (!ctx.in.takeRParen()) {
      return ctx.in.err("expected ')' at end of try_table");
    }
  } else {
    if (!ctx.in.takeKeyword("end"sv)) {
      return ctx.in.err("expected 'end' at end of try_table");
    }

    auto id = ctx.in.takeID();
    if (id && id != label) {
      return ctx.in.err("end label does not match try_table label");
    }
  }
  return ctx.visitEnd();
}